

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void OPLL_EnvelopeOutput(opll_t *chip)

{
  uint local_14;
  int32_t level;
  opll_t *chip_local;
  
  local_14 = (uint)chip->eg_ksltl + (uint)chip->eg_level[(ulong)(chip->cycles + 0x11) % 0x12];
  if (chip->c_am != '\0') {
    local_14 = chip->lfo_am_out + local_14;
  }
  if (0x7f < local_14) {
    local_14 = 0x7f;
  }
  if ((chip->testmode & 1) != 0) {
    local_14._0_1_ = '\0';
  }
  chip->eg_out = (uint8_t)local_14;
  return;
}

Assistant:

static void OPLL_EnvelopeOutput(opll_t *chip) {
    int32_t level = chip->eg_level[(chip->cycles+17)%18];

    level += chip->eg_ksltl;

    if (chip->c_am) {
        level += chip->lfo_am_out;
    }

    if (level >= 128) {
        level = 127;
    }

    if (chip->testmode & 0x01) {
        level = 0;
    }

    chip->eg_out = level;
}